

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intmem.h
# Opt level: O0

unsigned_short intmem::loadu_be<unsigned_short>(uint8_t *Ptr)

{
  unsigned_short uVar1;
  uint8_t *Ptr_local;
  
  uVar1 = loadu<unsigned_short>(Ptr);
  uVar1 = bswap_be<unsigned_short>(uVar1);
  return uVar1;
}

Assistant:

static INTMEM_CE T loadu_be(const uint8_t* Ptr)
{
#ifdef INTMEM_CPP20_SUPPORT
  if (std::is_constant_evaluated()) {
    T Ret = 0;
    for (size_t I = 0; I < sizeof(T); ++I) {
      Ret |= ((T)Ptr[I]) << ((sizeof(T)-I-1)*8);
    }
    return Ret;
  }
#endif
  return bswap_be(loadu<T>(Ptr));
}